

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

int __thiscall HPresolve::getSingColElementIndexInA(HPresolve *this,int j)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar1;
  ostream *poVar2;
  size_type __n;
  size_type __n_00;
  int iVar3;
  size_type __n_01;
  char *pcVar4;
  vector<int,_std::allocator<int>_> *this_02;
  
  __n_01 = (size_type)j;
  pvVar1 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Astart,__n_01);
  __n = (size_type)*pvVar1;
  this_01 = &(this->super_HPreData).flagRow;
  this_00 = &(this->super_HPreData).Aindex;
  iVar3 = *pvVar1 + -1;
  do {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)*pvVar1);
    __n = __n + 1;
    iVar3 = iVar3 + 1;
  } while (*pvVar1 == 0);
  this_02 = &(this->super_HPreData).Aend;
  pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_02,__n_01);
  if (iVar3 < *pvVar1) {
    do {
      __n_00 = __n;
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_02,__n_01);
      if ((long)*pvVar1 <= (long)__n_00) break;
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)*pvVar1);
      __n = __n_00 + 1;
    } while (*pvVar1 == 0);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(this_02,__n_01);
    if (*pvVar1 <= (int)__n_00) {
      return iVar3;
    }
    pcVar4 = "Error during presolve: more variables found in singleton col ";
  }
  else {
    pcVar4 = "Error during presolve: no variable found in singleton col ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,j);
  std::operator<<(poVar2,".");
  return -1;
}

Assistant:

int HPresolve::getSingColElementIndexInA(int j) {
	int k=Astart.at(j);
    while (!flagRow.at(Aindex.at(k)))
           ++k ;
    if (k >= Aend.at(j)) {
		cout<<"Error during presolve: no variable found in singleton col "<<j<<".";
		return -1;
	}
    int rest = k+1;
	while (rest < Aend.at(j) && !flagRow.at(Aindex.at(rest)))
		++rest ;
	if (rest < Aend.at(j)) {
		cout<<"Error during presolve: more variables found in singleton col "<<j<<".";
		return -1;
	}
    return k;
}